

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O2

void cfd::js::api::ParseTapBranch
               (vector<cfd::js::api::TapScriptTreeItemStruct,_std::allocator<cfd::js::api::TapScriptTreeItemStruct>_>
                *list,TapBranch *branch,uint8_t depth)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  reference branch_00;
  uint32_t uVar4;
  uint8_t depth_00;
  size_type __n;
  string past_branch_hash;
  TapScriptTreeItemStruct item;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  long local_110;
  allocator local_100 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  TapScriptTreeItemStruct leaf_data;
  
  cfd::core::TapBranch::GetBranchList();
  uVar3 = (local_110 - _branches) / 0x78;
  TapScriptTreeItemStruct::TapScriptTreeItemStruct(&leaf_data);
  leaf_data.depth = (int)uVar3 + (uint)depth;
  cfd::core::TapBranch::GetBaseHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&leaf_data.tap_branch_hash,(string *)&item);
  std::__cxx11::string::~string((string *)&item);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&past_branch_hash);
  cVar1 = cfd::core::TapBranch::HasTapLeaf();
  if (cVar1 == '\0') {
    std::__cxx11::string::string((string *)&item,"tapscript",(allocator *)&past_branch_hash);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&leaf_data.ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item);
    std::__cxx11::string::~string((string *)&item);
    std::__cxx11::string::string((string *)&item,"leafVersion",(allocator *)&past_branch_hash);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&leaf_data.ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item);
    std::__cxx11::string::~string((string *)&item);
  }
  else {
    cfd::core::TapBranch::GetScript();
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&leaf_data.tapscript);
    std::__cxx11::string::~string((string *)&past_branch_hash);
    core::Script::~Script((Script *)&item);
    bVar2 = cfd::core::TapBranch::GetLeafVersion();
    leaf_data.leaf_version = (int64_t)bVar2;
  }
  std::__cxx11::string::string((string *)&item,"relatedBranchHash",(allocator *)&past_branch_hash);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&leaf_data.ignore_items,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item);
  std::__cxx11::string::~string((string *)&item);
  std::
  vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
  ::emplace_back<cfd::js::api::TapScriptTreeItemStruct&>
            ((vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
              *)list,&leaf_data);
  std::__cxx11::string::string((string *)&past_branch_hash,(string *)&leaf_data.tap_branch_hash);
  depth_00 = (char)uVar3 + depth;
  uVar4 = (uint)depth + (int)uVar3;
  for (__n = 0; uVar4 = uVar4 - 1, (uVar3 & 0xffffffff) != __n; __n = __n + 1) {
    branch_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                          (&branches,__n);
    TapScriptTreeItemStruct::TapScriptTreeItemStruct(&item);
    item.depth = uVar4;
    cfd::core::TapBranch::GetBranchHash('\0');
    cfd::core::ByteData256::GetHex_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&item.tap_branch_hash,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &item.related_branch_hash,&past_branch_hash);
    cfd::core::TapBranch::GetCurrentBranchHash();
    cfd::core::ByteData256::GetHex_abi_cxx11_();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &item.related_branch_hash,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
    std::__cxx11::string::string((string *)&local_e8,"tapscript",local_100);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&item.ignore_items,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_e8,"leafVersion",local_100);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&item.ignore_items,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::
    vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
    ::emplace_back<cfd::js::api::TapScriptTreeItemStruct&>
              ((vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
                *)list,&item);
    std::__cxx11::string::_M_assign((string *)&past_branch_hash);
    ParseTapBranch(list,branch_00,depth_00);
    TapScriptTreeItemStruct::~TapScriptTreeItemStruct(&item);
    depth_00 = depth_00 + 0xff;
  }
  std::__cxx11::string::~string((string *)&past_branch_hash);
  TapScriptTreeItemStruct::~TapScriptTreeItemStruct(&leaf_data);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&branches);
  return;
}

Assistant:

static void ParseTapBranch(
    std::vector<TapScriptTreeItemStruct>* list, const TapBranch& branch,
    uint8_t depth) {
  auto branches = branch.GetBranchList();
  uint32_t branch_max = static_cast<uint32_t>(branches.size());
  TapScriptTreeItemStruct leaf_data;
  leaf_data.depth = branch_max + depth;
  leaf_data.tap_branch_hash = branch.GetBaseHash().GetHex();
  if (branch.HasTapLeaf()) {
    leaf_data.tapscript = branch.GetScript().GetHex();
    leaf_data.leaf_version = branch.GetLeafVersion();
  } else {
    leaf_data.ignore_items.insert("tapscript");
    leaf_data.ignore_items.insert("leafVersion");
  }
  leaf_data.ignore_items.insert("relatedBranchHash");
  list->emplace_back(leaf_data);

  std::string past_branch_hash = leaf_data.tap_branch_hash;
  for (uint32_t index = 0; index < branch_max; ++index) {
    uint32_t current_depth = branch_max - 1 - index + depth;
    auto& target_branch = branches.at(index);
    // set value (branch hash)
    TapScriptTreeItemStruct item;
    item.depth = current_depth;
    item.tap_branch_hash =
        branch.GetBranchHash(static_cast<uint8_t>(index)).GetHex();
    item.related_branch_hash.emplace_back(past_branch_hash);
    item.related_branch_hash.emplace_back(
        target_branch.GetCurrentBranchHash().GetHex());
    item.ignore_items.insert("tapscript");
    item.ignore_items.insert("leafVersion");
    list->emplace_back(item);
    past_branch_hash = item.tap_branch_hash;

    ParseTapBranch(list, target_branch, current_depth + 1);
  }
}